

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

void __thiscall
PathEscapingSensiblePathsAreNotNeedlesslyEscaped::PathEscapingSensiblePathsAreNotNeedlesslyEscaped
          (PathEscapingSensiblePathsAreNotNeedlesslyEscaped *this)

{
  PathEscapingSensiblePathsAreNotNeedlesslyEscaped *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__PathEscapingSensiblePathsAreNotNeedlesslyEscaped_00265960;
  return;
}

Assistant:

TEST(PathEscaping, SensiblePathsAreNotNeedlesslyEscaped) {
  const char* path = "some/sensible/path/without/crazy/characters.c++";
  string result;

  GetWin32EscapedString(path, &result);
  EXPECT_EQ(path, result);
  result.clear();

  GetShellEscapedString(path, &result);
  EXPECT_EQ(path, result);
}